

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O3

Comment * __thiscall soul::getComment(Comment *__return_storage_ptr__,soul *this,Context *context)

{
  Comment *extraout_RAX;
  CodeLocation local_20;
  
  if (this != (soul *)0x0) {
    *(int *)this = *(int *)this + 1;
  }
  local_20.sourceCode.object = (SourceCodeText *)this;
  local_20.location.data = (char *)context;
  SourceCodeUtilities::findPrecedingComment(__return_storage_ptr__,&local_20);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)this);
  return extraout_RAX;
}

Assistant:

static SourceCodeUtilities::Comment getComment (const AST::Context& context)
{
    return SourceCodeUtilities::findPrecedingComment (context.location);
}